

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O0

uint __thiscall CompilerStatistics::Total(CompilerStatistics *this)

{
  uint uVar1;
  Timer *pTVar2;
  uint local_18;
  uint local_14;
  uint i;
  uint total;
  CompilerStatistics *this_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    uVar1 = SmallArray<CompilerStatistics::Timer,_16U>::size(&this->timers);
    if (uVar1 <= local_18) break;
    pTVar2 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,local_18);
    local_14 = pTVar2->total + local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

unsigned Total()
	{
		unsigned total = 0;

		for(unsigned i = 0; i < timers.size(); i++)
			total += timers[i].total;

		return total;
	}